

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnElemSegmentElemType
          (BinaryReaderInterp *this,Index index,Type elem_type)

{
  pointer pEVar1;
  Result RVar2;
  Location loc;
  Location local_28;
  
  pEVar1 = (this->module_->elems).
           super__Vector_base<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pEVar1[-1].type.enum_ = elem_type.enum_;
  pEVar1[-1].type.type_index_ = elem_type.type_index_;
  local_28.field_1.field_0.last_column = 0;
  local_28.filename._M_len = (this->filename_)._M_len;
  local_28.filename._M_str = (this->filename_)._M_str;
  local_28.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  RVar2 = SharedValidator::OnElemSegmentElemType(&this->validator_,&local_28,elem_type);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderInterp::OnElemSegmentElemType(Index index, Type elem_type) {
  ElemDesc& elem = module_.elems.back();
  elem.type = elem_type;
  return validator_.OnElemSegmentElemType(GetLocation(), elem_type);
}